

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularMatrix.h
# Opt level: O0

void Eigen::internal::
     triangular_assignment_loop<Eigen::internal::triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>,_10U,_-1,_false>
     ::run(triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>
           *kernel)

{
  Index IVar1;
  long *plVar2;
  triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>
  *in_RDI;
  Index i;
  Index maxi;
  Index j;
  long local_38;
  long row;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
  *pgVar3;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
  *this;
  
  pgVar3 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
            *)0x0;
  while( true ) {
    this = pgVar3;
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
            ::cols((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
                    *)0x150806);
    if (IVar1 <= (long)pgVar3) break;
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
            ::rows((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
                    *)0x150821);
    plVar2 = std::min<long>((long *)&stack0xffffffffffffffe0,(long *)&stack0xffffffffffffffd0);
    row = *plVar2;
    for (local_38 = 0; local_38 < row; local_38 = local_38 + 1) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
      ::assignCoeff(this,row,IVar1);
    }
    IVar1 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
            ::rows((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
                    *)0x15089d);
    if (local_38 < IVar1) {
      triangular_dense_assignment_kernel<2,_8,_0,_Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::swap_assign_op<double>,_0>
      ::assignDiagonalCoeff(in_RDI,local_38);
    }
    pgVar3 = (generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U>_>,_Eigen::internal::evaluator<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::swap_assign_op<double>,_1>
              *)((long)&this->m_dst + 1);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(Kernel &kernel)
  {
    for(Index j = 0; j < kernel.cols(); ++j)
    {
      Index maxi = numext::mini(j, kernel.rows());
      Index i = 0;
      if (((Mode&Lower) && SetOpposite) || (Mode&Upper))
      {
        for(; i < maxi; ++i)
          if(Mode&Upper) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
      else
        i = maxi;
      
      if(i<kernel.rows()) // then i==j
        kernel.assignDiagonalCoeff(i++);
      
      if (((Mode&Upper) && SetOpposite) || (Mode&Lower))
      {
        for(; i < kernel.rows(); ++i)
          if(Mode&Lower) kernel.assignCoeff(i, j);
          else           kernel.assignOppositeCoeff(i, j);
      }
    }
  }